

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall nite::Shader::Shader(Shader *this,string *frag,string *vert)

{
  string *vert_local;
  string *frag_local;
  Shader *this_local;
  
  std::__cxx11::string::string((string *)&this->shaderName);
  std::__cxx11::string::string((string *)&this->fragFilename);
  std::__cxx11::string::string((string *)&this->vertFilename);
  this->id = -1;
  load(this,frag,vert);
  return;
}

Assistant:

nite::Shader::Shader(const String &frag, const String &vert){
	id = -1;
	load(frag, vert);
}